

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O2

bool __thiscall
cmBuildCommand::TwoArgsSignature
          (cmBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *name;
  bool bVar1;
  char *pcVar2;
  cmGlobalGenerator *this_00;
  ulong uVar3;
  allocator local_aa;
  allocator local_a9;
  string configType;
  string makecommand;
  string local_68;
  string local_48;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)name;
  if (uVar3 < 0x21) {
    std::__cxx11::string::string
              ((string *)&configType,"called with less than two arguments",(allocator *)&makecommand
              );
    cmCommand::SetError(&this->super_cmCommand,&configType);
  }
  else {
    pcVar2 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
    configType._M_dataplus._M_p = (pointer)&configType.field_2;
    configType._M_string_length = 0;
    configType.field_2._M_local_buf[0] = '\0';
    bVar1 = cmsys::SystemTools::GetEnv("CMAKE_CONFIG_TYPE",&configType);
    if (!bVar1 || configType._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&configType);
    }
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&local_48,"",&local_a9);
    std::__cxx11::string::string((string *)&local_68,"",&local_aa);
    bVar1 = cmMakefile::IgnoreErrorsCMP0061((this->super_cmCommand).Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              (&makecommand,this_00,&local_48,&configType,&local_68,bVar1);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    if (pcVar2 == (char *)0x0) {
      cmMakefile::AddCacheDefinition
                ((this->super_cmCommand).Makefile,name,makecommand._M_dataplus._M_p,
                 "Command used to build entire project from the command line.",STRING,false);
    }
    std::__cxx11::string::~string((string *)&makecommand);
  }
  std::__cxx11::string::~string((string *)&configType);
  return 0x20 < uVar3;
}

Assistant:

bool cmBuildCommand::TwoArgsSignature(std::vector<std::string> const& args)
{
  if (args.size() < 2) {
    this->SetError("called with less than two arguments");
    return false;
  }

  std::string const& define = args[0];
  const char* cacheValue = this->Makefile->GetDefinition(define);

  std::string configType;
  if (!cmSystemTools::GetEnv("CMAKE_CONFIG_TYPE", configType) ||
      configType.empty()) {
    configType = "Release";
  }

  std::string makecommand =
    this->Makefile->GetGlobalGenerator()->GenerateCMakeBuildCommand(
      "", configType, "", this->Makefile->IgnoreErrorsCMP0061());

  if (cacheValue) {
    return true;
  }
  this->Makefile->AddCacheDefinition(define, makecommand.c_str(),
                                     "Command used to build entire project "
                                     "from the command line.",
                                     cmStateEnums::STRING);
  return true;
}